

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  int iVar1;
  undefined1 str [8];
  bool bVar2;
  char **in_RDX;
  char **extraout_RDX;
  undefined1 path [8];
  int iVar3;
  long lVar4;
  undefined1 local_58 [8];
  string arg_string;
  
  iVar3 = 1;
  arg_string.field_2._8_8_ = argc;
  do {
    if (*(int *)arg_string.field_2._8_8_ <= iVar3) {
      if (g_help_flag != '\0') {
        PrintColorEncoded((char *)argc);
      }
      return;
    }
    lVar4 = (long)iVar3;
    StreamableToString<char*>((string *)local_58,(internal *)(argv + lVar4),in_RDX);
    str = local_58;
    bVar2 = ParseGoogleTestFlag((char *)local_58);
    if (bVar2) {
LAB_001c0072:
      iVar1 = *(int *)arg_string.field_2._8_8_;
      for (; iVar1 != lVar4; lVar4 = lVar4 + 1) {
        argv[lVar4] = argv[lVar4 + 1];
      }
      *(int *)arg_string.field_2._8_8_ = iVar1 + -1;
      iVar3 = iVar3 + -1;
    }
    else {
      path = str;
      bVar2 = ParseStringFlag<std::__cxx11::string>
                        ((char *)str,"flagfile",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &FLAGS_gtest_flagfile_abi_cxx11_);
      if (bVar2) {
        LoadFlagsFromFile((string *)path);
        goto LAB_001c0072;
      }
      bVar2 = std::operator==((string *)local_58,"--help");
      if ((((bVar2) || (bVar2 = std::operator==((string *)local_58,"-h"), bVar2)) ||
          (bVar2 = std::operator==((string *)local_58,"-?"), bVar2)) ||
         ((bVar2 = std::operator==((string *)local_58,"/?"), bVar2 ||
          (bVar2 = HasGoogleTestFlagPrefix((char *)str), bVar2)))) {
        g_help_flag = '\x01';
      }
    }
    argc = (int *)local_58;
    std::__cxx11::string::~string((string *)local_58);
    iVar3 = iVar3 + 1;
    in_RDX = extraout_RDX;
  } while( true );
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    bool remove_flag = false;
    if (ParseGoogleTestFlag(arg)) {
      remove_flag = true;
#if GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (ParseStringFlag(arg, kFlagfileFlag, &GTEST_FLAG(flagfile))) {
      LoadFlagsFromFile(GTEST_FLAG(flagfile));
      remove_flag = true;
#endif  // GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }

    if (remove_flag) {
      // Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}